

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<TPZGeoElSide>::ReallocForNuma(TPZVec<TPZGeoElSide> *this)

{
  ulong uVar1;
  TPZGeoElSide *__src;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  size_t sVar6;
  
  uVar1 = this->fNElements;
  if ((uVar1 != 0) && (__src = this->fStore, __src != (TPZGeoElSide *)0x0)) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar3 = SUB168(auVar2 * ZEXT816(0x18),0);
    uVar4 = uVar3 + 8;
    if (0xfffffffffffffff7 < uVar3) {
      uVar4 = 0xffffffffffffffff;
    }
    uVar3 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
      uVar3 = uVar4;
    }
    puVar5 = (ulong *)operator_new__(uVar3);
    *puVar5 = uVar1;
    sVar6 = 0;
    do {
      *(undefined ***)((long)puVar5 + sVar6 + 8) = &PTR__TPZGeoElSide_01920090;
      *(undefined8 *)((long)puVar5 + sVar6 + 0x10) = 0;
      *(undefined4 *)((long)puVar5 + sVar6 + 0x18) = 0xffffffff;
      sVar6 = sVar6 + 0x18;
    } while (uVar1 * 0x18 != sVar6);
    memcpy((TPZGeoElSide *)(puVar5 + 1),__src,uVar1 * 0x18);
    operator_delete__(&__src[-1].fSide,*(long *)&__src[-1].fSide * 0x18 + 8);
    this->fStore = (TPZGeoElSide *)(puVar5 + 1);
  }
  return;
}

Assistant:

void ReallocForNuma() {
        if (fNElements == 0 || fStore == NULL)
            return;
        T* newStore = new T[fNElements];
        memcpy((void*)newStore,(void*)fStore,fNElements*sizeof(T));
        delete [] fStore;
        fStore = newStore;
	}